

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFormat.cpp
# Opt level: O0

void __thiscall
ser::FileFormat::Init
          (FileFormat *this,string *directory,string *prefix,MetainfoSet *globalMetainfo,
          FieldsTable *fieldsTable,OffsetTable *offsetTable)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  int local_3c;
  OffsetTable *pOStack_38;
  int size;
  OffsetTable *offsetTable_local;
  FieldsTable *fieldsTable_local;
  MetainfoSet *globalMetainfo_local;
  string *prefix_local;
  string *directory_local;
  FileFormat *this_local;
  
  pOStack_38 = offsetTable;
  offsetTable_local = (OffsetTable *)fieldsTable;
  fieldsTable_local = (FieldsTable *)globalMetainfo;
  globalMetainfo_local = (MetainfoSet *)prefix;
  prefix_local = directory;
  directory_local = (string *)this;
  local_3c = std::__cxx11::string::size();
  while( true ) {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)prefix_local);
    if (*pcVar1 != '/') break;
    local_3c = local_3c + -1;
  }
  std::__cxx11::string::substr((ulong)&local_80,(ulong)prefix_local);
  std::operator+(&local_60,&local_80,'/');
  std::__cxx11::string::operator=((string *)&this->directory_,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::operator=((string *)&this->prefix_,(string *)globalMetainfo_local);
  this->pGlobalMetainfo_ = (MetainfoSet *)fieldsTable_local;
  this->pFieldsTable_ = (FieldsTable *)offsetTable_local;
  this->pOffsetTable_ = pOStack_38;
  return;
}

Assistant:

void FileFormat::Init (const std::string& directory, const std::string& prefix,
                       MetainfoSet& globalMetainfo, FieldsTable& fieldsTable, OffsetTable& offsetTable)
{
    // Remove trailing /
    int size = directory.size();
    while (directory[size-1] == '/')
        --size;

    directory_ = directory.substr(0, size) + '/';
    prefix_ = prefix;
    pGlobalMetainfo_ = &globalMetainfo;
    pFieldsTable_ = &fieldsTable;
    pOffsetTable_ = &offsetTable;
}